

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *
GEO::InstanceRepo::instance<GEO::Factory<GEO::FactoryCreator1<GEO::Delaunay,unsigned_char>>>(void)

{
  char *pcVar1;
  Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *local_48;
  Instance *instance;
  allocator local_29;
  string local_28 [8];
  string name;
  
  pcVar1 = std::type_info::name
                     ((type_info *)
                      &Factory<GEO::FactoryCreator1<GEO::Delaunay,unsigned_char>>::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_48 = (Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *)get((string *)local_28)
  ;
  if (local_48 == (Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *)0x0) {
    local_48 = (Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *)operator_new(0x40);
    Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_>::Factory(local_48);
    add((string *)local_28,(Instance *)local_48);
  }
  std::__cxx11::string::~string(local_28);
  return local_48;
}

Assistant:

static InstanceType& instance() {
            const std::string name = typeid(InstanceType).name();
            Instance* instance = get(name);
            if(instance == nullptr) {
                instance = new InstanceType;
                add(name, instance);
            }
            return *static_cast<InstanceType*>(instance);
        }